

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::MessageGenerator::class_name_abi_cxx11_
          (string *__return_storage_ptr__,MessageGenerator *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)(this->descriptor_ + 8))
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string MessageGenerator::class_name() {
  return std::string(descriptor_->name());
}